

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFTextString.cpp
# Opt level: O0

string * __thiscall
PDFTextString::ToUTF8FromUTF16BE_abi_cxx11_(string *__return_storage_ptr__,PDFTextString *this)

{
  undefined1 local_68 [8];
  EStatusCodeAndString result;
  undefined1 local_30 [8];
  UnicodeString unicodeString;
  PDFTextString *this_local;
  
  unicodeString.mUnicodeCharacters.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl._M_node._M_size = (size_t)this;
  UnicodeString::UnicodeString((UnicodeString *)local_30);
  UnicodeString::FromUTF16((UnicodeString *)local_30,&this->mTextString);
  UnicodeString::ToUTF8_abi_cxx11_((EStatusCodeAndString *)local_68,(UnicodeString *)local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&result);
  std::
  pair<PDFHummus::EStatusCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<PDFHummus::EStatusCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_68);
  UnicodeString::~UnicodeString((UnicodeString *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string PDFTextString::ToUTF8FromUTF16BE() const
{
	UnicodeString unicodeString;

	unicodeString.FromUTF16(mTextString);

	EStatusCodeAndString result = unicodeString.ToUTF8();
	return result.second;
}